

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

void __thiscall
PlanningUnitMADPDiscrete::ComputeHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index hI,Index t,Index t_offset,Index *Indices,
          size_t indexDomainSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [64];
  undefined1 in_XMM2 [16];
  undefined1 extraout_var [56];
  
  auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,indexDomainSize);
  uVar7 = hI - t_offset;
  iVar5 = t - 1;
  for (lVar6 = 0; (ulong)t << 2 != lVar6; lVar6 = lVar6 + 4) {
    auVar1 = vcvtusi2sd_avx512f(in_XMM2,iVar5);
    auVar8._0_8_ = pow(auVar2._0_8_,auVar1._0_8_);
    auVar8._8_56_ = extraout_var;
    uVar4 = vcvttsd2usi_avx512f(auVar8._0_16_);
    iVar5 = iVar5 + -1;
    iVar3 = (int)(uVar7 / uVar4);
    *(int *)((long)Indices + lVar6) = iVar3;
    uVar7 = uVar7 - (int)uVar4 * iVar3;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::ComputeHistoryArrays
    (
        Index hI, //index of the history
        Index t,  //stage of hI
        Index t_offset, //the offset within t
        Index Indices[], //the computed individual indices
        size_t indexDomainSize //the indices range from 0...(indexDomainSize-1)

    ) const
{
    //let's hope the compiler optimizes out the obvious inefficientcies here
    //(I left them for readability)

    //substract the offset to find out what is the index within the 
    //time-step-t-histories.
    Index hI_withinT = hI - t_offset;   
    Index remainder = hI_withinT;
    size_t vec_size = t; // the number of indices  we are searching
    size_t nrO = indexDomainSize;
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // suppose we have a oh = < oI[3], oI[2], o[1], oI[0] >
        // (the numbers represent the stage of the oI)
        // ->then this history is for stage 4 (we have that t=4).
        //
        // the ohI is generated by: 
        //      ohI= oI[3] * nrO^3 + ... +oI[0] * nrO^0
        //
        // we reconstruct this by performing
        // oI[3] = ohI /  nrO^3
        // remainder = ohI - (oI^3)
        // oI[2] = remainder / nrO^2
        // etc.
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrO, (double)(stage));
        Index oI_t2 = remainder / b;
        Indices[t2] = oI_t2;
        remainder -= oI_t2 * b;
    }
}